

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O0

int formk_(integer *n,integer *nsub,integer *ind,integer *nenter,integer *ileave,integer *indx2,
          integer *iupdat,logical *updatd,doublereal *wn,doublereal *wn1,integer *m,doublereal *ws,
          doublereal *wy,doublereal *sy,doublereal *theta,integer *col,integer *head,integer *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *in_RCX;
  long in_RDX;
  long lVar16;
  int *in_RSI;
  int *in_RDI;
  integer *in_R8;
  long in_R9;
  doublereal dVar17;
  int *in_stack_00000008;
  integer i__3;
  integer i__2;
  integer i__1;
  integer sy_offset;
  integer sy_dim1;
  integer wy_offset;
  integer wy_dim1;
  integer ws_offset;
  integer ws_dim1;
  integer wn1_offset;
  integer wn1_dim1;
  integer wn_offset;
  integer wn_dim1;
  int in_stack_ffffffffffffff98;
  integer iVar18;
  integer iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  lVar10 = in_R9 + -4;
  lVar11 = in_RDX + -4;
  iVar20 = *_ws_offset;
  iVar1 = iVar20 + 1;
  lVar16 = (long)iVar1;
  iVar21 = *in_RDI;
  iVar2 = iVar21 + 1;
  lVar12 = _wn_offset + (long)iVar2 * -8;
  iVar22 = *in_RDI;
  iVar3 = iVar22 + 1;
  lVar13 = _wn1_offset + (long)iVar3 * -8;
  iVar4 = *_ws_offset * 2;
  iVar5 = iVar4 + 1;
  lVar14 = _wy_offset + (long)iVar5 * -8;
  iVar6 = *_ws_offset * 2;
  iVar7 = iVar6 + 1;
  lVar15 = _sy_offset + (long)iVar7 * -8;
  if (*_i__2 == 0) {
    formk_::upcl = *nenter;
  }
  else {
    if (*_ws_offset < *in_stack_00000008) {
      iVar8 = *_ws_offset + -1;
      for (formk_::jy = 1; formk_::jy <= iVar8; formk_::jy = formk_::jy + 1) {
        formk_::js = *_ws_offset + formk_::jy;
        Wcopy_((integer *)&stack0xffffffffffffff98,
               (doublereal *)(lVar14 + (long)(formk_::jy + 1 + (formk_::jy + 1) * iVar4) * 8),&c__1,
               (doublereal *)(lVar14 + (long)(formk_::jy + formk_::jy * iVar4) * 8),&c__1);
        Wcopy_((integer *)&stack0xffffffffffffff98,
               (doublereal *)(lVar14 + (long)(formk_::js + 1 + (formk_::js + 1) * iVar4) * 8),&c__1,
               (doublereal *)(lVar14 + (long)(formk_::js + formk_::js * iVar4) * 8),&c__1);
        in_stack_ffffffffffffff98 = *_ws_offset + -1;
        Wcopy_((integer *)&stack0xffffffffffffff98,
               (doublereal *)(lVar14 + (long)(*_ws_offset + 2 + (formk_::jy + 1) * iVar4) * 8),&c__1
               ,(doublereal *)(lVar14 + (long)(*_ws_offset + 1 + formk_::jy * iVar4) * 8),&c__1);
      }
    }
    formk_::pbegin = 1;
    formk_::pend = *in_RSI;
    formk_::dbegin = *in_RSI + 1;
    formk_::dend = *in_RDI;
    formk_::iy = *nenter;
    formk_::is = *_ws_offset + *nenter;
    formk_::ipntr = *ind + *nenter + -1;
    if (*_ws_offset < formk_::ipntr) {
      formk_::ipntr = formk_::ipntr - *_ws_offset;
    }
    formk_::jpntr = *ind;
    iVar8 = *nenter;
    for (formk_::jy = 1; iVar19 = formk_::dend, formk_::jy <= iVar8; formk_::jy = formk_::jy + 1) {
      formk_::js = *_ws_offset + formk_::jy;
      formk_::temp1 = 0.0;
      formk_::temp2 = 0.0;
      formk_::temp3 = 0.0;
      for (formk_::k = formk_::pbegin; formk_::k <= formk_::pend; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar11 + (long)formk_::k * 4);
        formk_::temp1 =
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::ipntr * iVar21) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp1;
      }
      for (formk_::k = formk_::dbegin; formk_::k <= formk_::dend; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar11 + (long)formk_::k * 4);
        formk_::temp2 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::jpntr * iVar22) * 8) + formk_::temp2;
        formk_::temp3 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp3;
      }
      *(doublereal *)(lVar14 + (long)(formk_::iy + formk_::jy * iVar4) * 8) = formk_::temp1;
      *(doublereal *)(lVar14 + (long)(formk_::is + formk_::js * iVar4) * 8) = formk_::temp2;
      *(doublereal *)(lVar14 + (long)(formk_::is + formk_::jy * iVar4) * 8) = formk_::temp3;
      formk_::jpntr = formk_::jpntr % *_ws_offset + 1;
      in_stack_ffffffffffffff98 = iVar19;
    }
    formk_::jy = *nenter;
    formk_::jpntr = *ind + *nenter + -1;
    if (*_ws_offset < formk_::jpntr) {
      formk_::jpntr = formk_::jpntr - *_ws_offset;
    }
    formk_::ipntr = *ind;
    iVar8 = *nenter;
    for (formk_::i__ = 1; iVar19 = formk_::pend, formk_::i__ <= iVar8; formk_::i__ = formk_::i__ + 1
        ) {
      formk_::temp3 = 0.0;
      for (formk_::k = formk_::pbegin; formk_::k <= formk_::pend; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar11 + (long)formk_::k * 4);
        formk_::temp3 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp3;
      }
      formk_::ipntr = formk_::ipntr % *_ws_offset + 1;
      *(doublereal *)(lVar14 + (long)(*_ws_offset + formk_::i__ + formk_::jy * iVar4) * 8) =
           formk_::temp3;
      in_stack_ffffffffffffff98 = iVar19;
    }
    formk_::upcl = *nenter + -1;
  }
  iVar19 = formk_::upcl;
  formk_::ipntr = *ind;
  for (formk_::iy = 1; iVar18 = formk_::iy, formk_::iy <= iVar19; formk_::iy = formk_::iy + 1) {
    formk_::is = *_ws_offset + formk_::iy;
    formk_::jpntr = *ind;
    for (formk_::jy = 1; formk_::jy <= iVar18; formk_::jy = formk_::jy + 1) {
      formk_::js = *_ws_offset + formk_::jy;
      formk_::temp1 = 0.0;
      formk_::temp2 = 0.0;
      formk_::temp3 = 0.0;
      formk_::temp4 = 0.0;
      for (formk_::k = 1; formk_::k <= *in_RCX; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar10 + (long)formk_::k * 4);
        formk_::temp1 =
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::ipntr * iVar21) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp1;
        formk_::temp2 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::jpntr * iVar22) * 8) + formk_::temp2;
      }
      for (formk_::k = *in_R8; formk_::k <= *in_RDI; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar10 + (long)formk_::k * 4);
        formk_::temp3 =
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::ipntr * iVar21) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp3;
        formk_::temp4 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::jpntr * iVar22) * 8) + formk_::temp4;
      }
      *(double *)(lVar14 + (long)(formk_::iy + formk_::jy * iVar4) * 8) =
           (*(double *)(lVar14 + (long)(formk_::iy + formk_::jy * iVar4) * 8) + formk_::temp1) -
           formk_::temp3;
      *(double *)(lVar14 + (long)(formk_::is + formk_::js * iVar4) * 8) =
           (*(double *)(lVar14 + (long)(formk_::is + formk_::js * iVar4) * 8) - formk_::temp2) +
           formk_::temp4;
      formk_::jpntr = formk_::jpntr % *_ws_offset + 1;
    }
    formk_::ipntr = formk_::ipntr % *_ws_offset + 1;
    in_stack_ffffffffffffff98 = iVar18;
  }
  formk_::ipntr = *ind;
  iVar8 = *_ws_offset + formk_::upcl;
  formk_::is = *_ws_offset;
  while (iVar19 = formk_::upcl, formk_::is = formk_::is + 1, formk_::is <= iVar8) {
    formk_::jpntr = *ind;
    for (formk_::jy = 1; formk_::jy <= iVar19; formk_::jy = formk_::jy + 1) {
      formk_::temp1 = 0.0;
      formk_::temp3 = 0.0;
      for (formk_::k = 1; formk_::k <= *in_RCX; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar10 + (long)formk_::k * 4);
        formk_::temp1 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp1;
      }
      for (formk_::k = *in_R8; formk_::k <= *in_RDI; formk_::k = formk_::k + 1) {
        formk_::k1 = *(int *)(lVar10 + (long)formk_::k * 4);
        formk_::temp3 =
             *(double *)(lVar13 + (long)(formk_::k1 + formk_::ipntr * iVar22) * 8) *
             *(double *)(lVar12 + (long)(formk_::k1 + formk_::jpntr * iVar21) * 8) + formk_::temp3;
      }
      if (formk_::jy + *_ws_offset < formk_::is) {
        *(double *)(lVar14 + (long)(formk_::is + formk_::jy * iVar4) * 8) =
             (*(double *)(lVar14 + (long)(formk_::is + formk_::jy * iVar4) * 8) - formk_::temp1) +
             formk_::temp3;
      }
      else {
        *(double *)(lVar14 + (long)(formk_::is + formk_::jy * iVar4) * 8) =
             (*(double *)(lVar14 + (long)(formk_::is + formk_::jy * iVar4) * 8) + formk_::temp1) -
             formk_::temp3;
      }
      formk_::jpntr = formk_::jpntr % *_ws_offset + 1;
    }
    formk_::ipntr = formk_::ipntr % *_ws_offset + 1;
    in_stack_ffffffffffffff98 = iVar19;
  }
  formk_::m2 = *_ws_offset << 1;
  iVar8 = *nenter;
  for (formk_::iy = 1; iVar19 = formk_::iy, formk_::iy <= iVar8; formk_::iy = formk_::iy + 1) {
    formk_::is = *nenter + formk_::iy;
    formk_::is1 = *_ws_offset + formk_::iy;
    for (formk_::jy = 1; formk_::jy <= iVar19; formk_::jy = formk_::jy + 1) {
      formk_::js = *nenter + formk_::jy;
      formk_::js1 = *_ws_offset + formk_::jy;
      *(double *)(lVar15 + (long)(formk_::jy + formk_::iy * iVar6) * 8) =
           *(double *)(lVar14 + (long)(formk_::iy + formk_::jy * iVar4) * 8) / *(double *)ileave;
      *(double *)(lVar15 + (long)(formk_::js + formk_::is * iVar6) * 8) =
           *(double *)(lVar14 + (long)(formk_::is1 + formk_::js1 * iVar4) * 8) * *(double *)ileave;
    }
    iVar9 = formk_::iy + -1;
    for (formk_::jy = 1; formk_::jy <= iVar9; formk_::jy = formk_::jy + 1) {
      *(ulong *)(lVar15 + (long)(formk_::jy + formk_::is * iVar6) * 8) =
           *(ulong *)(lVar14 + (long)(formk_::is1 + formk_::jy * iVar4) * 8) ^ 0x8000000000000000;
    }
    in_stack_ffffffffffffff98 = *nenter;
    for (formk_::jy = formk_::iy; formk_::jy <= in_stack_ffffffffffffff98;
        formk_::jy = formk_::jy + 1) {
      *(undefined8 *)(lVar15 + (long)(formk_::jy + formk_::is * iVar6) * 8) =
           *(undefined8 *)(lVar14 + (long)(formk_::is1 + formk_::jy * iVar4) * 8);
    }
    lVar10 = (long)(formk_::iy + formk_::iy * iVar6);
    *(double *)(lVar15 + lVar10 * 8) =
         *(double *)(indx2 + lVar16 * -2 + (long)(formk_::iy + formk_::iy * iVar20) * 2) +
         *(double *)(lVar15 + lVar10 * 8);
  }
  dpofa_((doublereal *)CONCAT44(iVar6,iVar7),(integer *)CONCAT44(iVar4,iVar5),
         (integer *)CONCAT44(iVar22,iVar3),(integer *)CONCAT44(iVar21,iVar2));
  if (*nsub == 0) {
    formk_::col2 = *nenter << 1;
    formk_::js = *nenter;
    iVar8 = formk_::col2;
    while (formk_::js = formk_::js + 1, formk_::js <= iVar8) {
      dtrsl_((doublereal *)CONCAT44(iVar6,iVar7),(integer *)CONCAT44(iVar4,iVar5),
             (integer *)CONCAT44(iVar22,iVar3),(doublereal *)CONCAT44(iVar21,iVar2),
             (integer *)CONCAT44(iVar20,iVar1),(integer *)CONCAT44(iVar8,in_stack_ffffffffffffff98))
      ;
    }
    formk_::is = *nenter;
    iVar19 = formk_::col2;
    while (formk_::is = formk_::is + 1, formk_::is <= iVar19) {
      iVar18 = formk_::col2;
      for (formk_::js = formk_::is; formk_::js <= iVar18; formk_::js = formk_::js + 1) {
        dVar17 = Wdot_(nenter,(doublereal *)(lVar15 + (long)(formk_::is * iVar6 + 1) * 8),&c__1,
                       (doublereal *)(lVar15 + (long)(formk_::js * iVar6 + 1) * 8),&c__1);
        lVar10 = (long)(formk_::is + formk_::js * iVar6);
        *(double *)(lVar15 + lVar10 * 8) = dVar17 + *(double *)(lVar15 + lVar10 * 8);
      }
    }
    dpofa_((doublereal *)CONCAT44(iVar6,iVar7),(integer *)CONCAT44(iVar4,iVar5),
           (integer *)CONCAT44(iVar22,iVar3),(integer *)CONCAT44(iVar21,iVar2));
    if (*nsub != 0) {
      *nsub = -2;
    }
  }
  else {
    *nsub = -1;
  }
  return 0;
}

Assistant:

int formk_(integer *n, integer *nsub, integer *ind, integer *
	nenter, integer *ileave, integer *indx2, integer *iupdat, logical *
	updatd, doublereal *wn, doublereal *wn1, integer *m, doublereal *ws, 
	doublereal *wy, doublereal *sy, doublereal *theta, integer *col, 
	integer *head, integer *info)
{
    /* System generated locals */
    integer wn_dim1, wn_offset, wn1_dim1, wn1_offset, ws_dim1, ws_offset, 
	    wy_dim1, wy_offset, sy_dim1, sy_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, k, k1, m2, is, js, iy, jy, is1, js1, col2, dend, pend;
    extern doublereal ddot_(integer *, doublereal *, integer *, doublereal *, 
	    integer *);
    static integer upcl;
    static doublereal temp1, temp2, temp3, temp4;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *), dcopy_(integer *, doublereal *, integer *, doublereal 
	    *, integer *), dtrsl_(doublereal *, integer *, integer *, 
	    doublereal *, integer *, integer *);
    static integer ipntr, jpntr, dbegin, pbegin;

/*     ************ */

/*     Subroutine formk */

/*     This subroutine forms  the LEL^T factorization of the indefinite */

/*       matrix    K = [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */
/*                                                    where E = [-I  0] */
/*                                                              [ 0  I] */
/*     The matrix K can be shown to be equal to the matrix M^[-1]N */
/*       occurring in section 5.1 of [1], as well as to the matrix */
/*       Mbar^[-1] Nbar in section 5.3. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the problem. */
/*       On exit n is unchanged. */

/*     nsub is an integer variable */
/*       On entry nsub is the number of subspace variables in free set. */
/*       On exit nsub is not changed. */

/*     ind is an integer array of dimension nsub. */
/*       On entry ind specifies the indices of subspace variables. */
/*       On exit ind is unchanged. */

/*     nenter is an integer variable. */
/*       On entry nenter is the number of variables entering the */
/*         free set. */
/*       On exit nenter is unchanged. */

/*     ileave is an integer variable. */
/*       On entry indx2(ileave),...,indx2(n) are the variables leaving */
/*         the free set. */
/*       On exit ileave is unchanged. */

/*     indx2 is an integer array of dimension n. */
/*       On entry indx2(1),...,indx2(nenter) are the variables entering */
/*         the free set, while indx2(ileave),...,indx2(n) are the */
/*         variables leaving the free set. */
/*       On exit indx2 is unchanged. */

/*     iupdat is an integer variable. */
/*       On entry iupdat is the total number of BFGS updates made so far. */
/*       On exit iupdat is unchanged. */

/*     updatd is a logical variable. */
/*       On entry 'updatd' is true if the L-BFGS matrix is updatd. */
/*       On exit 'updatd' is unchanged. */

/*     wn is a double precision array of dimension 2m x 2m. */
/*       On entry wn is unspecified. */
/*       On exit the upper triangle of wn stores the LEL^T factorization */
/*         of the 2*col x 2*col indefinite matrix */
/*                     [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */

/*     wn1 is a double precision array of dimension 2m x 2m. */
/*       On entry wn1 stores the lower triangular part of */
/*                     [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*         in the previous iteration. */
/*       On exit wn1 stores the corresponding updated matrices. */
/*       The purpose of wn1 is just to store these inner products */
/*       so they can be easily updated and inserted into wn. */

/*     m is an integer variable. */
/*       On entry m is the maximum number of variable metric corrections */
/*         used to define the limited memory matrix. */
/*       On exit m is unchanged. */

/*     ws, wy, sy, and wtyy are double precision arrays; */
/*     theta is a double precision variable; */
/*     col is an integer variable; */
/*     head is an integer variable. */
/*       On entry they store the information defining the */
/*                                          limited memory BFGS matrix: */
/*         ws(n,m) stores S, a set of s-vectors; */
/*         wy(n,m) stores Y, a set of y-vectors; */
/*         sy(m,m) stores S'Y; */
/*         wtyy(m,m) stores the Cholesky factorization */
/*                                   of (theta*S'S+LD^(-1)L') */
/*         theta is the scaling factor specifying B_0 = theta I; */
/*         col is the number of variable metric corrections stored; */
/*         head is the location of the 1st s- (or y-) vector in S (or Y). */
/*       On exit they are unchanged. */

/*     info is an integer variable. */
/*       On entry info is unspecified. */
/*       On exit info =  0 for normal return; */
/*                    = -1 when the 1st Cholesky factorization failed; */
/*                    = -2 when the 2st Cholesky factorization failed. */

/*     Subprograms called: */

/*       Linpack ... dcopy, dpofa, dtrsl. */


/*     References: */
/*       [1] R. H. Byrd, P. Lu, J. Nocedal and C. Zhu, ``A limited */
/*       memory algorithm for bound constrained optimization'', */
/*       SIAM J. Scientific Computing 16 (1995), no. 5, pp. 1190--1208. */

/*       [2] C. Zhu, R.H. Byrd, P. Lu, J. Nocedal, ``L-BFGS-B: a */
/*       limited memory FORTRAN code for solving bound constrained */
/*       optimization problems'', Tech. Report, NAM-11, EECS Department, */
/*       Northwestern University, 1994. */

/*       (Postscript files of these papers are available via anonymous */
/*        ftp to eecs.nwu.edu in the directory pub/lbfgs/lbfgs_bcm.) */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the lower triangular part of */
/*               WN1 = [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*        where L_a is the strictly lower triangular part of S'AA'Y */
/*              R_z is the upper triangular part of S'ZZ'Y. */
    /* Parameter adjustments */
    --indx2;
    --ind;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wy_dim1 = *n;
    wy_offset = 1 + wy_dim1;
    wy -= wy_offset;
    ws_dim1 = *n;
    ws_offset = 1 + ws_dim1;
    ws -= ws_offset;
    wn1_dim1 = 2 * *m;
    wn1_offset = 1 + wn1_dim1;
    wn1 -= wn1_offset;
    wn_dim1 = 2 * *m;
    wn_offset = 1 + wn_dim1;
    wn -= wn_offset;

    /* Function Body */
    if (*updatd) {
	if (*iupdat > *m) {
/*                                 shift old part of WN1. */
	    i__1 = *m - 1;
	    for (jy = 1; jy <= i__1; ++jy) {
		js = *m + jy;
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[jy + 1 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			jy + jy * wn1_dim1], &c__1);
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[js + 1 + (js + 1) * wn1_dim1], &c__1, &wn1[
			js + js * wn1_dim1], &c__1);
		i__2 = *m - 1;
		dcopy_(&i__2, &wn1[*m + 2 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			*m + 1 + jy * wn1_dim1], &c__1);
/* L10: */
	    }
	}
/*          put new rows in blocks (1,1), (2,1) and (2,2). */
	pbegin = 1;
	pend = *nsub;
	dbegin = *nsub + 1;
	dend = *n;
	iy = *col;
	is = *m + *col;
	ipntr = *head + *col - 1;
	if (ipntr > *m) {
	    ipntr -= *m;
	}
	jpntr = *head;
	i__1 = *col;
	for (jy = 1; jy <= i__1; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
/*             compute element jy of row 'col' of Y'ZZ'Y */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
/* L15: */
	    }
/*             compute elements jy of row 'col' of L_a and S'AA'S */
	    i__2 = dend;
	    for (k = dbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L16: */
	    }
	    wn1[iy + jy * wn1_dim1] = temp1;
	    wn1[is + js * wn1_dim1] = temp2;
	    wn1[is + jy * wn1_dim1] = temp3;
	    jpntr = jpntr % *m + 1;
/* L20: */
	}
/*          put new column in block (2,1). */
	jy = *col;
	jpntr = *head + *col - 1;
	if (jpntr > *m) {
	    jpntr -= *m;
	}
	ipntr = *head;
	i__1 = *col;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    is = *m + i__;
	    temp3 = 0.;
/*             compute element i of column 'col' of R_z */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L25: */
	    }
	    ipntr = ipntr % *m + 1;
	    wn1[is + jy * wn1_dim1] = temp3;
/* L30: */
	}
	upcl = *col - 1;
    } else {
	upcl = *col;
    }
/*       modify the old parts in blocks (1,1) and (2,2) due to changes */
/*       in the set of free variables. */
    ipntr = *head;
    i__1 = upcl;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *m + iy;
	jpntr = *head;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
	    temp4 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L35: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp4 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L36: */
	    }
	    wn1[iy + jy * wn1_dim1] = wn1[iy + jy * wn1_dim1] + temp1 - temp3;
	    wn1[is + js * wn1_dim1] = wn1[is + js * wn1_dim1] - temp2 + temp4;
	    jpntr = jpntr % *m + 1;
/* L40: */
	}
	ipntr = ipntr % *m + 1;
/* L45: */
    }
/*       modify the old parts in block (2,1). */
    ipntr = *head;
    i__1 = *m + upcl;
    for (is = *m + 1; is <= i__1; ++is) {
	jpntr = *head;
	i__2 = upcl;
	for (jy = 1; jy <= i__2; ++jy) {
	    temp1 = 0.;
	    temp3 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L50: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L51: */
	    }
	    if (is <= jy + *m) {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] + temp1 - 
			temp3;
	    } else {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] - temp1 + 
			temp3;
	    }
	    jpntr = jpntr % *m + 1;
/* L55: */
	}
	ipntr = ipntr % *m + 1;
/* L60: */
    }
/*     Form the upper triangle of WN = [D+Y' ZZ'Y/theta   -L_a'+R_z' ] */
/*                                     [-L_a +R_z        S'AA'S*theta] */
    m2 = *m << 1;
    i__1 = *col;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *col + iy;
	is1 = *m + iy;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *col + jy;
	    js1 = *m + jy;
	    wn[jy + iy * wn_dim1] = wn1[iy + jy * wn1_dim1] / *theta;
	    wn[js + is * wn_dim1] = wn1[is1 + js1 * wn1_dim1] * *theta;
/* L65: */
	}
	i__2 = iy - 1;
	for (jy = 1; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = -wn1[is1 + jy * wn1_dim1];
/* L66: */
	}
	i__2 = *col;
	for (jy = iy; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = wn1[is1 + jy * wn1_dim1];
/* L67: */
	}
	wn[iy + iy * wn_dim1] += sy[iy + iy * sy_dim1];
/* L70: */
    }
/*     Form the upper triangle of WN= [  LL'            L^-1(-L_a'+R_z')] */
/*                                    [(-L_a +R_z)L'^-1   S'AA'S*theta  ] */
/*        first Cholesky factor (1,1) block of wn to get LL' */
/*                          with L' stored in the upper triangle of wn. */
    dpofa_(&wn[wn_offset], &m2, col, info);
    if (*info != 0) {
	*info = -1;
	return 0;
    }
/*        then form L^-1(-L_a'+R_z') in the (1,2) block. */
    col2 = *col << 1;
    i__1 = col2;
    for (js = *col + 1; js <= i__1; ++js) {
	dtrsl_(&wn[wn_offset], &m2, col, &wn[js * wn_dim1 + 1], &c__11, info);
/* L71: */
    }
/*     Form S'AA'S*theta + (L^-1(-L_a'+R_z'))'L^-1(-L_a'+R_z') in the */
/*        upper triangle of (2,2) block of wn. */
    i__1 = col2;
    for (is = *col + 1; is <= i__1; ++is) {
	i__2 = col2;
	for (js = is; js <= i__2; ++js) {
	    wn[is + js * wn_dim1] += ddot_(col, &wn[is * wn_dim1 + 1], &c__1, 
		    &wn[js * wn_dim1 + 1], &c__1);
/* L74: */
	}
/* L72: */
    }
/*     Cholesky factorization of (2,2) block of wn. */
    dpofa_(&wn[*col + 1 + (*col + 1) * wn_dim1], &m2, col, info);
    if (*info != 0) {
	*info = -2;
	return 0;
    }
    return 0;
}